

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O0

void __thiscall
slang::ast::StreamingConcatenationExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (StreamingConcatenationExpression *this,SampledValueExprVisitor *visitor)

{
  iterator pSVar1;
  Expression *this_00;
  StreamExpression *stream;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *local_20;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *__range3;
  SampledValueExprVisitor *visitor_local;
  StreamingConcatenationExpression *this_local;
  
  __range3 = (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
              *)visitor;
  visitor_local = (SampledValueExprVisitor *)this;
  ___begin3 = streams(this);
  local_20 = (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
              *)&__begin3;
  __end3 = nonstd::span_lite::
           span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
           ::begin(local_20);
  pSVar1 = nonstd::span_lite::
           span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
           ::end(local_20);
  for (; __end3 != pSVar1; __end3 = __end3 + 1) {
    this_00 = not_null<const_slang::ast::Expression_*>::operator->(&__end3->operand);
    Expression::visit<slang::ast::SampledValueExprVisitor&>
              (this_00,(SampledValueExprVisitor *)__range3);
    if (__end3->withExpr != (Expression *)0x0) {
      Expression::visit<slang::ast::SampledValueExprVisitor&>
                (__end3->withExpr,(SampledValueExprVisitor *)__range3);
    }
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& stream : streams()) {
            stream.operand->visit(visitor);
            if (stream.withExpr)
                stream.withExpr->visit(visitor);
        }
    }